

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void issue245(void)

{
  _Bool _Var1;
  roaring_bitmap_t *r;
  uint32_t min;
  char *__s;
  
  r = roaring_bitmap_create_with_capacity(0);
  roaring_bitmap_add_range_closed(r,0,8);
  min = 10;
  do {
    roaring_bitmap_add_range_closed(r,min,min);
    min = min + 2;
  } while (min != 0x1008);
  _Var1 = check_serialization(r);
  if (_Var1) {
    roaring_bitmap_add_range_closed(r,0x100a,0x100a);
    _Var1 = check_serialization(r);
    if (_Var1) {
      roaring_bitmap_free(r);
      return;
    }
    __s = "Bitmaps do not match at 2049 entries";
  }
  else {
    __s = "Bitmaps do not match at 2048 entries";
  }
  puts(__s);
  abort();
}

Assistant:

bool roaring_iterator_sumall(uint32_t value, void *param) {
    *(uint32_t *)param += value;
    return true;  // continue till the end
}